

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O3

int coda_bin_cursor_read_double(coda_cursor_conflict *cursor,double *dst)

{
  coda_type_class cVar1;
  ulong bit_offset;
  double dVar2;
  int iVar3;
  int iVar4;
  coda_type *pcVar5;
  
  pcVar5 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar5->format) {
    pcVar5 = *(coda_type **)&pcVar5->type_class;
  }
  bit_offset = cursor->stack[(long)cursor->n + -1].bit_offset;
  cVar1 = pcVar5[1].type_class;
  if ((bit_offset & 7) == 0) {
    iVar3 = read_bytes(cursor->product,(long)bit_offset >> 3,8,dst);
  }
  else {
    iVar3 = read_bits(cursor->product,bit_offset,0x40,(uint8_t *)dst);
  }
  iVar4 = -1;
  if (iVar3 == 0) {
    iVar4 = 0;
    if (cVar1 == coda_record_class) {
      dVar2 = *dst;
      *dst = (double)((ulong)dVar2 >> 0x38 | ((ulong)dVar2 & 0xff000000000000) >> 0x28 |
                      ((ulong)dVar2 & 0xff0000000000) >> 0x18 | ((ulong)dVar2 & 0xff00000000) >> 8 |
                      ((ulong)dVar2 & 0xff000000) << 8 | ((ulong)dVar2 & 0xff0000) << 0x18 |
                      ((ulong)dVar2 & 0xff00) << 0x28 | (long)dVar2 << 0x38);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int coda_bin_cursor_read_double(const coda_cursor *cursor, double *dst)
{
    return read_double(cursor, dst);
}